

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

double double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  DiyFp diy_fp;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  undefined4 in_ECX;
  byte in_DL;
  bool sign_00;
  undefined8 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  long in_FS_OFFSET;
  bool bVar12;
  double in_XMM0_Qa;
  byte in_stack_00000008;
  undefined1 *in_stack_00000010;
  double result;
  int written_exponent;
  bool is_negative;
  int middle_value;
  bool zero_tail;
  int dropped_bits;
  int dropped_bits_mask;
  int overflow_bits_count;
  int overflow;
  int digit;
  bool post_decimal;
  int radix;
  int exponent;
  int64_t number;
  int kSignificandSize;
  int kSingleSize;
  int kDoubleSize;
  Double *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  uc16 separator_00;
  uint in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  int local_90;
  char local_81;
  int local_78;
  int local_74;
  int local_70;
  int local_64;
  uint64_t local_60;
  double local_30;
  DiyFp local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sign_00 = (bool)(in_DL & 1);
  uVar8 = in_R8D & 1;
  uVar9 = in_R8D & 1;
  uVar2 = in_R8D & 1;
  uVar3 = in_R8D & 1;
  uVar5 = in_R8D & 1;
  uVar1 = in_R9D & 1;
  uVar4 = in_R9D & 1;
  sVar6 = 0x18;
  if ((in_stack_00000008 & 1) != 0) {
    sVar6 = 0x35;
  }
  *in_stack_00000010 = 1;
  local_60 = 0;
  local_64 = 0;
  bVar12 = false;
  do {
    if (*(char *)*in_RDI != '0') goto LAB_00706afa;
    bVar7 = Advance<char_const*>
                      ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
                       (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                       (int)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
  } while (!bVar7);
  *in_stack_00000010 = 0;
  local_30 = SignedZero(sign_00);
  goto LAB_00707128;
LAB_00706afa:
  bVar7 = IsDecimalDigitForRadix((int)*(char *)*in_RDI,0x10);
  local_30 = in_XMM0_Qa;
  if (bVar7) {
    local_70 = *(char *)*in_RDI + -0x30;
    if (bVar12) {
      local_64 = local_64 + -4;
    }
  }
  else {
    bVar7 = IsCharacterDigitForRadix((int)*(char *)*in_RDI,0x10,'a');
    if (bVar7) {
      local_70 = *(char *)*in_RDI + -0x57;
      if (bVar12) {
        local_64 = local_64 + -4;
      }
    }
    else {
      bVar7 = IsCharacterDigitForRadix((int)*(char *)*in_RDI,0x10,'A');
      if (!bVar7) {
        if ((uVar8 == 0) || (*(char *)*in_RDI != '.')) {
          if ((((uVar9 == 0) || ((*(char *)*in_RDI != 'p' && (*(char *)*in_RDI != 'P')))) &&
              (uVar1 == 0)) &&
             (bVar12 = AdvanceToNonspace<char_const*>
                                 ((char **)in_stack_ffffffffffffff48,(char *)0x706c81), bVar12))
          goto LAB_00707128;
          goto LAB_00706f06;
        }
        bVar12 = true;
        Advance<char_const*>
                  ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
                   (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),(int)in_stack_ffffffffffffff50,
                   (char **)in_stack_ffffffffffffff48);
        goto LAB_00706afa;
      }
      local_70 = *(char *)*in_RDI + -0x37;
      if (bVar12) {
        local_64 = local_64 + -4;
      }
    }
  }
  local_60 = local_60 * 0x10 + (long)local_70;
  local_74 = (int)((long)local_60 >> sVar6);
  if (local_74 == 0) {
    bVar7 = Advance<char_const*>
                      ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
                       (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                       (int)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
    if (bVar7) goto LAB_00706f06;
    goto LAB_00706afa;
  }
  local_78 = 1;
  for (; 1 < local_74; local_74 = local_74 >> 1) {
    local_78 = local_78 + 1;
  }
  bVar11 = (byte)local_78;
  uVar8 = (uint)local_60 & (1 << (bVar11 & 0x1f)) - 1U;
  local_60 = (long)local_60 >> (bVar11 & 0x3f);
  local_64 = local_78 + local_64;
  local_81 = '\x01';
  while (bVar7 = Advance<char_const*>
                           ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
                            (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                            (int)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48),
        !bVar7) {
    uVar9 = in_stack_ffffffffffffff58;
    if ((uVar2 != 0) && (*(char *)*in_RDI == '.')) {
      Advance<char_const*>
                ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
                 (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),(int)in_stack_ffffffffffffff50,
                 (char **)in_stack_ffffffffffffff48);
      bVar12 = true;
      uVar9 = in_stack_ffffffffffffff58;
    }
    bVar7 = isDigit((int)*(char *)*in_RDI,0x10);
    in_stack_ffffffffffffff58 = uVar9;
    if (!bVar7) break;
    in_stack_ffffffffffffff58 = uVar9 & 0xffffff;
    if (local_81 != '\0') {
      in_stack_ffffffffffffff58 = CONCAT13(*(char *)*in_RDI == '0',(int3)uVar9);
    }
    local_81 = (char)(in_stack_ffffffffffffff58 >> 0x18);
    if (!bVar12) {
      local_64 = local_64 + 4;
    }
  }
  if (((uVar3 == 0) && (uVar4 == 0)) &&
     (bVar12 = AdvanceToNonspace<char_const*>((char **)in_stack_ffffffffffffff48,(char *)0x706e2b),
     bVar12)) goto LAB_00707128;
  uVar9 = 1 << (bVar11 - 1 & 0x1f);
  if ((int)uVar9 < (int)uVar8) {
    local_60 = local_60 + 1;
  }
  else if ((uVar8 == uVar9) && (((local_60 & 1) != 0 || (local_81 == '\0')))) {
    local_60 = local_60 + 1;
  }
  if ((local_60 & 1L << sVar6) != 0) {
    local_64 = local_64 + 1;
    local_60 = (long)local_60 >> 1;
  }
LAB_00706f06:
  *in_stack_00000010 = 0;
  if (uVar5 != 0) {
    Advance<char_const*>
              ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
               (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),(int)in_stack_ffffffffffffff50,
               (char **)in_stack_ffffffffffffff48);
    bVar12 = false;
    separator_00 = (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30);
    if (*(char *)*in_RDI == '+') {
      Advance<char_const*>
                ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),separator_00,
                 (int)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
    }
    else {
      bVar12 = *(char *)*in_RDI == '-';
      if (bVar12) {
        Advance<char_const*>
                  ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),separator_00,
                   (int)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
      }
    }
    local_90 = 0;
    do {
      bVar7 = IsDecimalDigitForRadix((int)*(char *)*in_RDI,10);
      if (!bVar7) break;
      iVar10 = local_90;
      if (local_90 < 1) {
        iVar10 = -local_90;
      }
      if (iVar10 < 0x17bb1) {
        local_90 = local_90 * 10 + (int)*(char *)*in_RDI + -0x30;
      }
      bVar7 = Advance<char_const*>
                        ((char **)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
                         (uc16)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                         (int)in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
    } while (!bVar7);
    if (bVar12) {
      local_90 = -local_90;
    }
    local_64 = local_90 + local_64;
  }
  if ((local_64 == 0) || (local_60 == 0)) {
    if (sign_00 != false) {
      if (local_60 == 0) {
        local_30 = -0.0;
        goto LAB_00707128;
      }
      local_60 = -local_60;
    }
    local_30 = (double)(long)local_60;
  }
  else {
    DiyFp::DiyFp(&local_18,local_60,local_64);
    diy_fp.f_._4_4_ = in_ECX;
    diy_fp.f_._0_4_ = in_R8D;
    diy_fp._8_8_ = in_stack_ffffffffffffff68;
    Double::Double(in_stack_ffffffffffffff48,diy_fp);
    local_30 = Double::value((Double *)0x7070db);
    if (sign_00 != false) {
      local_30 = -local_30;
    }
  }
LAB_00707128:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}